

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_sound_srcs.cxx
# Opt level: O2

void __thiscall xray_re::xr_sound_src_object::save_v12(xr_sound_src_object *this,xr_ini_writer *w)

{
  size_t in_RCX;
  size_t __n;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  void *__buf_06;
  void *__buf_07;
  string asStack_38 [32];
  
  xr_custom_object::save_v12(&this->super_xr_custom_object,w);
  xr_ini_writer::write(w,0x1d290f,__buf,in_RCX);
  xr_ini_writer::write
            (w,0x1c66ca,(void *)(ulong)*(uint *)&(this->super_xr_custom_object).field_0x6c,in_RCX);
  xr_ini_writer::write(w,0x1d291b,__buf_00,in_RCX);
  xr_ini_writer::write(w,0x1d2920,__buf_01,in_RCX);
  xr_ini_writer::write(w,0x1d292c,__buf_02,in_RCX);
  xr_ini_writer::write(w,0x1d2935,__buf_03,in_RCX);
  xr_ini_writer::write(w,0x1d293e,__buf_04,in_RCX);
  xr_ini_writer::write(w,0x1d2948,__buf_05,in_RCX);
  std::__cxx11::string::string(asStack_38,(string *)&this->m_source_name);
  __n = 0;
  xr_ini_writer::write(w,0x1d2955,asStack_38,0);
  std::__cxx11::string::~string(asStack_38);
  xr_ini_writer::write(w,0x1d295e,__buf_06,__n);
  xr_ini_writer::write(w,0x1d296b,(void *)(ulong)this->m_type,__n);
  xr_ini_writer::write(w,0x1d3f45,(void *)0x14,__n);
  xr_ini_writer::write(w,0x1d2974,__buf_07,__n);
  return;
}

Assistant:

void xr_sound_src_object::save_v12(xr_ini_writer* w) const
{
	xr_custom_object::save_v12(w);

	w->write("active_time", m_active_time);
	w->write("flags", m_flags);
	w->write("freq", m_frequency);
	w->write("max_ai_dist", m_max_ai_dist);
	w->write("max_dist", m_max_dist);
	w->write("min_dist", m_min_dist);
	w->write("play_time", m_play_time);
	w->write("random_pause", m_pause_time);
	w->write("snd_name", m_source_name, false);
	w->write("snd_position", m_sound_pos);
	w->write("snd_type", m_type);

	w->write("version", SOUNDSRC_VERSION);
	w->write("volume", m_volume);
}